

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictoc.cc
# Opt level: O2

void bsplib::TicToc::print_stats(MPI_Comm comm,ostream *out)

{
  undefined8 uVar1;
  ostream *poVar2;
  double *pdVar3;
  ulong uVar4;
  int k;
  long lVar5;
  int j;
  int iVar6;
  long lVar7;
  size_t i;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  int P;
  size_t max_count;
  size_t local_count;
  MPI_Comm local_68;
  vector<double,_std::allocator<double>_> record;
  vector<double,_std::allocator<double>_> allrecords;
  
  MPI_Comm_size(comm,&P);
  std::vector<double,_std::allocator<double>_>::vector
            (&allrecords,(long)P << 2,(allocator_type *)&record);
  std::vector<double,_std::allocator<double>_>::vector(&record,4,(allocator_type *)&local_count);
  std::operator<<(out,"        seconds PID        MB PID    MB/sec PID     Count PID\n");
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 8) = 3;
  uVar8 = 1;
  local_68 = comm;
  do {
    if ((ulong)(DAT_0011b318 - s_timers >> 5) <= uVar8) {
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&record.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&allrecords.super__Vector_base<double,_std::allocator<double>_>);
      return;
    }
    lVar9 = uVar8 * 0x20;
    local_count = *(size_t *)(s_timers + 0x18 + lVar9);
    max_count = 0;
    MPI_Allreduce(&local_count,&max_count,1,&ompi_mpi_unsigned_long,&ompi_mpi_op_max,comm);
    lVar7 = s_timers;
    if (max_count != 0) {
      dVar11 = (double)*(long *)(s_timers + 8 + lVar9) * 1e-09 + (double)*(long *)(s_timers + lVar9)
      ;
      *record.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = dVar11;
      uVar1 = *(undefined8 *)(lVar7 + 0x10 + lVar9);
      dVar12 = (((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) - 1.9342813113834067e+25)
               + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1e-06;
      record.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = dVar12;
      record.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = dVar12 / dVar11;
      uVar1 = *(undefined8 *)(lVar7 + 0x18 + lVar9);
      record.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[3] = ((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) -
                    1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      MPI_Allgather();
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        poVar2 = std::operator<<(out,(char *)((long)&DAT_00114fa0 +
                                             (long)(int)(&DAT_00114fa0)[lVar7]));
        std::operator<<(poVar2,"  ");
        lVar9 = 0x20;
        for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
          dVar11 = allrecords.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar5];
          pdVar3 = (double *)
                   ((long)allrecords.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar9);
          uVar10 = 0;
          for (uVar4 = 1; (long)uVar4 < (long)P; uVar4 = uVar4 + 1) {
            dVar12 = *pdVar3;
            iVar6 = (int)lVar7;
            if (iVar6 == 2) {
              dVar11 = dVar11 + dVar12;
            }
            else if (iVar6 == 1) {
              if (dVar11 < dVar12) goto LAB_00111275;
            }
            else if ((iVar6 == 0) && (dVar12 < dVar11)) {
LAB_00111275:
              uVar10 = uVar4 & 0xffffffff;
              dVar11 = dVar12;
            }
            pdVar3 = pdVar3 + 4;
          }
          *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 10;
          if (lVar7 == 2) {
            poVar2 = std::ostream::_M_insert<double>(dVar11 / (double)P);
            std::operator<<(poVar2,"    ");
          }
          else {
            poVar2 = std::ostream::_M_insert<double>(dVar11);
            *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 4;
            std::ostream::operator<<((ostream *)poVar2,(int)uVar10);
          }
          lVar9 = lVar9 + 8;
        }
        uVar4 = 1;
        do {
          poVar2 = std::operator<<(out,' ');
          *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0x10;
          std::operator<<(poVar2,&DAT_00114f60 +
                                 *(int *)(&DAT_00114f60 + ((uVar8 / uVar4) % 0xf) * 4));
          uVar4 = uVar4 * 0xf;
        } while (uVar4 < uVar8);
        std::operator<<(out,'\n');
      }
      std::operator<<(out,'\n');
      comm = local_68;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void TicToc::print_stats(MPI_Comm comm, std::ostream & out)
    {
        const char * names[] = 
          { "DUMMY", "TOTAL", "SYNC", "PUT", "GET", "HPPUT", "HPGET", 
            "BSMP", "MPI_META_A2A", "MPI_SMALL_A2A", "MPI_LARGE_RECV",
            "MPI_LARGE_SEND", "MPI_PUT", "MPI_UNBUF",
            "IMBALANCE",
            "UNKNOWN"
          };
        const char * op[] = { "Min", "Max", "Avg" };
        enum { Min, Max, Avg };
        const int s=0, mb=1, mbs=2, count=3;

        int P; MPI_Comm_size( comm, &P);
        std::vector< double > allrecords(4*P), record(4);

        out << "        seconds PID        MB PID    MB/sec PID     Count PID\n";
        out << std::setprecision(3);
        for (size_t i = 1; i < s_timers.size(); ++i ) {

            std::size_t local_count = s_timers[i].count, max_count = 0;
            MPI_Allreduce( &local_count, &max_count, 1, MY_MPI_SIZE_T, 
                    MPI_MAX, comm );
            if (max_count == 0 ) continue;

            record[s]     = sec( s_timers[i].time );
            record[mb]    = s_timers[i].nbytes * 1e-6;
            record[mbs]   = record[mb] / record[s];
            record[count] = 1.0 * s_timers[i].count;

            MPI_Allgather( record.data(), 4, MPI_DOUBLE,
                    allrecords.data(), 4, MPI_DOUBLE,
                    comm );

            for (int j = 0; j < 3; ++j ) {
                out << op[j] << "  ";

                for (int k = 0; k < 4; ++k ) {
                    double x = allrecords[k];
                    int pid  = 0;
                    for (int p = 1; p < P; ++p) {
                        double y = allrecords[p*4+k];
                        switch( j )  {
                            case Min: if ( y < x ) { x = y; pid = p; }
                                      break;
                            case Max: if ( y > x ) { x = y; pid = p; }
                                      break;
                            case Avg: x += y;
                                      break;
                        }
                    }
                    if (j == Avg) { 
                        out << std::setw(10) << (x/P) << "    ";
                    } else {
                        out << std::setw(10) << x << std::setw(4) << pid;
                    }

                }

                size_t pos = i;
                size_t pow = 1;
                do {
                    unsigned j = (pos / pow) % N_CATEGORIES;
                    pow *= N_CATEGORIES;

                    out << ' ' << std::setw(16) << names[j];

                } while (pos > pow);
                out << '\n';
            }
            out << '\n';    
        }
    }